

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O1

void writeInitialLength(InitialLength *Length,raw_ostream *OS,bool IsLittleEndian)

{
  uint uVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  size_t local_30;
  uint local_24;
  
  uVar1 = Length->TotalLength;
  local_24 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if ((int)CONCAT71(in_register_00000011,IsLittleEndian) != 0) {
    local_24 = uVar1;
  }
  llvm::raw_ostream::write(OS,(int)&local_24,(void *)0x4,(ulong)local_24);
  if (Length->TotalLength == 0xffffffff) {
    uVar2 = Length->TotalLength64;
    local_30 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
               | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
               (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    if (IsLittleEndian) {
      local_30 = uVar2;
    }
    llvm::raw_ostream::write(OS,(int)&local_30,&DAT_00000008,local_30);
  }
  return;
}

Assistant:

static void writeInitialLength(const DWARFYAML::InitialLength &Length,
                               raw_ostream &OS, bool IsLittleEndian) {
  writeInteger((uint32_t)Length.TotalLength, OS, IsLittleEndian);
  if (Length.isDWARF64())
    writeInteger((uint64_t)Length.TotalLength64, OS, IsLittleEndian);
}